

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void rsg::(anonymous_namespace)::computeEqualityValueRange<true,bool>
               (Random *rnd,bool dstMin,bool dstMax,bool *aMin,bool *aMax,bool *bMin,bool *bMax)

{
  deBool dVar1;
  bool bVar2;
  bool bVar3;
  
  if (dstMax && !dstMin) {
    *aMin = false;
    *aMax = true;
    bVar3 = true;
    bVar2 = false;
  }
  else {
    dVar1 = deRandom_getBool(&rnd->m_rnd);
    bVar3 = dVar1 == 1;
    *aMin = bVar3;
    *aMax = bVar3;
    bVar2 = bVar3;
    if (!dstMin) {
      bVar3 = dVar1 != 1;
      bVar2 = bVar3;
    }
  }
  *bMin = bVar2;
  *bMax = bVar3;
  return;
}

Assistant:

void computeEqualityValueRange<true, bool> (de::Random& rnd, bool dstMin, bool dstMax, bool& aMin, bool& aMax, bool& bMin, bool& bMax)
{
	if (dstMin == false && dstMax == true)
	{
		aMin	= false;
		aMax	= true;
		bMin	= false;
		bMax	= true;
	}
	else if (dstMin == false)
	{
		DE_ASSERT(dstMax == false);
		bool val = rnd.getBool();

		aMin	= val;
		aMax	= val;
		bMin	= !val;
		bMax	= !val;
	}
	else
	{
		DE_ASSERT(dstMin == true && dstMax == true);
		bool val = rnd.getBool();

		aMin	= val;
		aMax	= val;
		bMin	= val;
		bMax	= val;
	}
}